

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O0

void AGSSock::SockAddr_set_Port(SockAddr *sa,ags_t port)

{
  uint16_t uVar1;
  sockaddr_in6 *addr_1;
  sockaddr_in *addr;
  ags_t port_local;
  SockAddr *sa_local;
  
  if ((sa->super_sockaddr_storage).ss_family == 2) {
    uVar1 = htons((uint16_t)port);
    *(uint16_t *)(sa->super_sockaddr_storage).__ss_padding = uVar1;
  }
  else if ((sa->super_sockaddr_storage).ss_family == 10) {
    uVar1 = htons((uint16_t)port);
    *(uint16_t *)(sa->super_sockaddr_storage).__ss_padding = uVar1;
  }
  return;
}

Assistant:

void SockAddr_set_Port(SockAddr *sa, ags_t port)
{
	if (sa->ss_family == AF_INET)
	{
		sockaddr_in *addr = reinterpret_cast<sockaddr_in *> (sa);
		addr->sin_port = htons(port);
	}
	else if (sa->ss_family == AF_INET6)
	{
		sockaddr_in6 *addr = reinterpret_cast<sockaddr_in6 *> (sa);
		addr->sin6_port = htons(port);
	}
}